

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O0

void __thiscall
blockencodings_tests::NonCoinbasePreforwardRTTest::test_method(NonCoinbasePreforwardRTTest *this)

{
  long lVar1;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l;
  initializer_list<std::shared_ptr<const_CTransaction>_> __l_00;
  bool bVar2;
  uint64_t uVar3;
  reference pvVar4;
  long in_FS_OFFSET;
  char *in_stack_ffffffffffffec68;
  PartiallyDownloadedBlock *in_stack_ffffffffffffec70;
  char *in_stack_ffffffffffffec78;
  PartiallyDownloadedBlock *in_stack_ffffffffffffec80;
  undefined4 in_stack_ffffffffffffec88;
  int in_stack_ffffffffffffec8c;
  CTxMemPool *in_stack_ffffffffffffec90;
  undefined4 in_stack_ffffffffffffec98;
  int in_stack_ffffffffffffec9c;
  CTxMemPoolEntry *in_stack_ffffffffffffeca0;
  CTxMemPool *in_stack_ffffffffffffeca8;
  CTxMemPool *in_stack_ffffffffffffecb0;
  CTransactionRef *in_stack_ffffffffffffecb8;
  undefined7 in_stack_ffffffffffffecc0;
  undefined1 in_stack_ffffffffffffecc7;
  CBlock *in_stack_ffffffffffffecc8;
  FastRandomContext *in_stack_ffffffffffffed20;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffed68;
  CBlock *in_stack_ffffffffffffed70;
  undefined4 in_stack_ffffffffffffed78;
  undefined4 in_stack_ffffffffffffed7c;
  PartiallyDownloadedBlock *pPVar5;
  PartiallyDownloadedBlock *pPVar6;
  PartiallyDownloadedBlock *local_11d8;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  *in_stack_ffffffffffffee50;
  undefined4 in_stack_ffffffffffffee58;
  undefined4 in_stack_ffffffffffffee5c;
  PartiallyDownloadedBlock *in_stack_ffffffffffffee60;
  CTxMemPool *pool;
  NonCoinbasePreforwardRTTest *this_local;
  undefined1 local_1008 [112];
  undefined1 local_f98 [32];
  undefined1 local_f78 [16];
  undefined1 local_f68 [64];
  undefined1 local_f28 [32];
  undefined1 local_f08 [16];
  undefined1 local_ef8 [64];
  const_string local_eb8 [2];
  lazy_ostream local_e98 [2];
  assertion_result local_e78 [2];
  undefined1 local_e40 [16];
  undefined1 local_e30 [64];
  undefined1 local_df0 [16];
  undefined1 local_de0 [64];
  const_string local_da0 [2];
  lazy_ostream local_d80 [4];
  assertion_result local_d40 [2];
  const_string local_d08 [2];
  lazy_ostream local_ce8 [2];
  assertion_result local_cc8 [2];
  bool mutated;
  PartiallyDownloadedBlock local_c88;
  lazy_ostream local_bd8 [2];
  undefined8 local_bb8;
  undefined8 uStack_bb0;
  undefined8 local_ba8;
  assertion_result local_ba0 [2];
  undefined1 local_b68 [144];
  lazy_ostream local_ad8 [2];
  assertion_result local_ab8 [2];
  const_string local_a80 [2];
  lazy_ostream local_a60 [2];
  assertion_result local_a40 [2];
  const_string local_a08 [2];
  lazy_ostream local_9e8 [2];
  assertion_result local_9c8 [2];
  const_string local_990 [2];
  lazy_ostream local_970 [2];
  assertion_result local_950 [2];
  DataStream stream;
  undefined1 local_8e0 [112];
  TestMemPoolEntryHelper entry;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock2;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock1;
  undefined1 local_7f0 [160];
  undefined1 local_750 [32];
  undefined1 local_730 [16];
  PartiallyDownloadedBlock partialBlockCopy;
  CBlock block3;
  undefined1 local_5e8 [16];
  PartiallyDownloadedBlock tmp_1;
  PartiallyDownloadedBlock tmp;
  CBlock block2;
  PartiallyDownloadedBlock partialBlock;
  CBlockHeaderAndShortTxIDs shortIDs2;
  TestHeaderAndShortIDs shortIDs;
  uint256 txhash;
  CBlock block;
  FastRandomContext rand_ctx;
  
  local_1008._8_8_ = (pointer)0x0;
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffeca8,
             (char *)in_stack_ffffffffffffeca0,in_stack_ffffffffffffec9c,
             (char *)in_stack_ffffffffffffec90,
             (char *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffec78);
  TestMemPoolEntryHelper::TestMemPoolEntryHelper
            ((TestMemPoolEntryHelper *)in_stack_ffffffffffffec68);
  uint256::uint256((uint256 *)in_stack_ffffffffffffec68,'\0');
  FastRandomContext::FastRandomContext
            ((FastRandomContext *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),
             (uint256 *)in_stack_ffffffffffffec80);
  BuildBlockTestCase(in_stack_ffffffffffffed20);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffeca8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffeca0,
             (char *)CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
             (char *)in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,
             SUB41((uint)in_stack_ffffffffffffec88 >> 0x18,0));
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffec68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffeca8,
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffeca0,
             (char *)CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
             (char *)in_stack_ffffffffffffec90,in_stack_ffffffffffffec8c,
             SUB41((uint)in_stack_ffffffffffffec88 >> 0x18,0));
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  TestMemPoolEntryHelper::FromTx
            ((TestMemPoolEntryHelper *)CONCAT17(in_stack_ffffffffffffecc7,in_stack_ffffffffffffecc0)
             ,in_stack_ffffffffffffecb8);
  CTxMemPool::addUnchecked(in_stack_ffffffffffffeca8,in_stack_ffffffffffffeca0);
  CTxMemPoolEntry::~CTxMemPoolEntry((CTxMemPoolEntry *)in_stack_ffffffffffffec68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffec68);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffec68);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_8e0._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_8e0._0_8_ = &DAT_00000004;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET + 0";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_8e0;
    in_stack_ffffffffffffec68 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_8e0 + 0x30,local_8e0 + 0x20,0x9b,1,2,local_8e0 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  uint256::uint256((uint256 *)in_stack_ffffffffffffec68);
  TestHeaderAndShortIDs::TestHeaderAndShortIDs
            ((TestHeaderAndShortIDs *)in_stack_ffffffffffffeca0,
             (CBlock *)CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
             (FastRandomContext *)in_stack_ffffffffffffec90);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::resize
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),
             (size_type)in_stack_ffffffffffffec80);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68,
             (shared_ptr<const_CTransaction> *)0x4304d8);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::operator[]
            ((vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *)
             in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  PrefilledTransaction::operator=
            ((PrefilledTransaction *)in_stack_ffffffffffffec78,
             (PrefilledTransaction *)in_stack_ffffffffffffec70);
  PrefilledTransaction::~PrefilledTransaction((PrefilledTransaction *)in_stack_ffffffffffffec68);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
             CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),
             (size_type)in_stack_ffffffffffffec80);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffec68);
  CTransaction::GetWitnessHash((CTransaction *)in_stack_ffffffffffffec68);
  uVar3 = TestHeaderAndShortIDs::GetShortID
                    ((TestHeaderAndShortIDs *)
                     CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
                     (Wtxid *)in_stack_ffffffffffffec90);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  *pvVar4 = uVar3;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffec68);
  CTransaction::GetWitnessHash((CTransaction *)in_stack_ffffffffffffec68);
  uVar3 = TestHeaderAndShortIDs::GetShortID
                    ((TestHeaderAndShortIDs *)
                     CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
                     (Wtxid *)in_stack_ffffffffffffec90);
  pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                     ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                      in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  *pvVar4 = uVar3;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  stream.m_read_pos = 0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  stream.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  DataStream::DataStream((DataStream *)in_stack_ffffffffffffec68);
  DataStream::operator<<
            ((DataStream *)in_stack_ffffffffffffec78,
             (TestHeaderAndShortIDs *)in_stack_ffffffffffffec70);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)
             CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98));
  DataStream::operator>>
            ((DataStream *)in_stack_ffffffffffffec78,
             (CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffec70);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),in_stack_ffffffffffffec90
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    PartiallyDownloadedBlock::InitData
              (in_stack_ffffffffffffee60,
               (CBlockHeaderAndShortTxIDs *)
               CONCAT44(in_stack_ffffffffffffee5c,in_stack_ffffffffffffee58),
               in_stack_ffffffffffffee50);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_950,local_970,local_990,0xaf,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffec80,(size_t)in_stack_ffffffffffffec78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9c8,local_9e8,local_a08,0xb0,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffec80,(size_t)in_stack_ffffffffffffec78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a40,local_a60,local_a80,0xb1,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    PartiallyDownloadedBlock::IsTxAvailable
              (in_stack_ffffffffffffec80,(size_t)in_stack_ffffffffffffec78);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ab8,local_ad8,(const_string *)(local_b68 + 0x70),0xb2,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffec68);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffec68);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_b68._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_b68._0_8_ = (pointer)0x5;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET + 1";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_b68;
    in_stack_ffffffffffffec68 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_b68 + 0x30,local_b68 + 0x20,0xb4,1,2,local_b68 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),in_stack_ffffffffffffec80
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    local_bb8 = 0;
    uStack_bb0 = 0;
    local_ba8 = 0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffec68);
    PartiallyDownloadedBlock::FillBlock
              ((PartiallyDownloadedBlock *)
               CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
               in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ba0,local_bd8,
               (const_string *)
               ((long)&local_c88.m_check_block_mock.super__Function_base._M_functor + 8),0xb9,CHECK,
               CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_ffffffffffffec78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PartiallyDownloadedBlock::operator=
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec78,in_stack_ffffffffffffec70);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec68);
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),in_stack_ffffffffffffec80
            );
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  std::shared_ptr<const_CTransaction>::shared_ptr
            ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68,
             (shared_ptr<const_CTransaction> *)0x431032);
  std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffec68);
  __l._M_len = (size_type)in_stack_ffffffffffffecb8;
  __l._M_array = (iterator)in_stack_ffffffffffffecb0;
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
            *)in_stack_ffffffffffffeca8,__l,(allocator_type *)in_stack_ffffffffffffeca0);
  PartiallyDownloadedBlock::FillBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),in_stack_ffffffffffffed70
             ,in_stack_ffffffffffffed68);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)in_stack_ffffffffffffec78);
  std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
            ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffec68);
  local_11d8 = &tmp_1;
  do {
    local_11d8 = (PartiallyDownloadedBlock *)
                 &local_11d8[-1].m_check_block_mock.super__Function_base._M_manager;
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
  } while (local_11d8 != (PartiallyDownloadedBlock *)local_5e8);
  PartiallyDownloadedBlock::operator=
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec78,in_stack_ffffffffffffec70);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffec68);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffec68);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_c88.prefilled_count =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_c88.txn_available.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x6;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET + 2";
    in_stack_ffffffffffffec70 = &local_c88;
    in_stack_ffffffffffffec68 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (&local_c88.pool,&local_c88.mempool_count,0xc3,1,2,&local_c88.prefilled_count);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    BlockMerkleRoot(in_stack_ffffffffffffecc8,
                    (bool *)CONCAT17(in_stack_ffffffffffffecc7,in_stack_ffffffffffffecc0));
    ::operator!=((base_blob<256U> *)in_stack_ffffffffffffec78,
                 (base_blob<256U> *)in_stack_ffffffffffffec70);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_cc8,local_ce8,local_d08,0xc5,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  CBlock::CBlock((CBlock *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
  PartiallyDownloadedBlock::PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)
             CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88),in_stack_ffffffffffffec80
            );
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
    std::shared_ptr<const_CTransaction>::shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68,
               (shared_ptr<const_CTransaction> *)0x43154a);
    std::allocator<std::shared_ptr<const_CTransaction>_>::allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffec68);
    __l_00._M_len = (size_type)in_stack_ffffffffffffecb8;
    __l_00._M_array = (iterator)in_stack_ffffffffffffecb0;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              *)in_stack_ffffffffffffeca8,__l_00,(allocator_type *)in_stack_ffffffffffffeca0);
    PartiallyDownloadedBlock::FillBlock
              ((PartiallyDownloadedBlock *)
               CONCAT44(in_stack_ffffffffffffed7c,in_stack_ffffffffffffed78),
               in_stack_ffffffffffffed70,in_stack_ffffffffffffed68);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d40,local_d80,local_da0,0xc9,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
               *)in_stack_ffffffffffffec78);
    std::allocator<std::shared_ptr<const_CTransaction>_>::~allocator
              ((allocator<std::shared_ptr<const_CTransaction>_> *)in_stack_ffffffffffffec68);
    pPVar6 = (PartiallyDownloadedBlock *)local_730;
    pPVar5 = &partialBlockCopy;
    do {
      pPVar5 = (PartiallyDownloadedBlock *)
               &pPVar5[-1].m_check_block_mock.super__Function_base._M_manager;
      std::shared_ptr<const_CTransaction>::~shared_ptr
                ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    } while (pPVar5 != pPVar6);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    in_stack_ffffffffffffed7c = CONCAT13(bVar2,(int3)in_stack_ffffffffffffed7c);
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffec70);
    CBlockHeader::GetHash
              ((CBlockHeader *)CONCAT44(in_stack_ffffffffffffec8c,in_stack_ffffffffffffec88));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffec70);
    in_stack_ffffffffffffec78 = "block3.GetHash().ToString()";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)(local_7f0 + 0x60);
    in_stack_ffffffffffffec68 = "block.GetHash().ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_de0,local_df0,0xca,1,2,local_750);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffec70);
    BlockMerkleRoot(in_stack_ffffffffffffecc8,
                    (bool *)CONCAT17(in_stack_ffffffffffffecc7,in_stack_ffffffffffffecc0));
    base_blob<256u>::ToString_abi_cxx11_((base_blob<256U> *)in_stack_ffffffffffffec70);
    in_stack_ffffffffffffec78 = "BlockMerkleRoot(block3, &mutated).ToString()";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_7f0;
    in_stack_ffffffffffffec68 = "block.hashMerkleRoot.ToString()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
              (local_e30,local_e40,0xcb,1,2,local_7f0 + 0x20);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec68);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)in_stack_ffffffffffffec78,
               SUB81((ulong)in_stack_ffffffffffffec70 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,
               (basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    in_stack_ffffffffffffec68 = (char *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e78,local_e98,local_eb8,0xcc,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)in_stack_ffffffffffffec68);
    boost::test_tools::assertion_result::~assertion_result
              ((assertion_result *)in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
    std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               in_stack_ffffffffffffec68);
    CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffec68);
    transaction_identifier::operator_cast_to_uint256_
              ((transaction_identifier<false> *)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_f28._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_f28._0_8_ = (pointer)0x7;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET + 3";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_f28;
    in_stack_ffffffffffffec68 = "pool.get(block.vtx[2]->GetHash()).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_ef8,local_f08,0xce,1,2,local_f28 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                *)in_stack_ffffffffffffec78,(size_type)in_stack_ffffffffffffec70);
  std::__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<const_CTransaction,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             in_stack_ffffffffffffec68);
  CTransaction::GetHash((CTransaction *)in_stack_ffffffffffffec68);
  transaction_identifier::operator_cast_to_uint256_
            ((transaction_identifier<false> *)in_stack_ffffffffffffec68);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffec68);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffec68);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::clear((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
           *)in_stack_ffffffffffffec68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_f98._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_f98._0_8_ = &DAT_00000004;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET + 1 - 1";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_f98;
    in_stack_ffffffffffffec68 = "pool.get(txhash).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_f68,local_f78,0xd4,1,2,local_f98 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec68);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffec68);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffec68);
  PartiallyDownloadedBlock::~PartiallyDownloadedBlock
            ((PartiallyDownloadedBlock *)in_stack_ffffffffffffec68);
  CBlockHeaderAndShortTxIDs::~CBlockHeaderAndShortTxIDs
            ((CBlockHeaderAndShortTxIDs *)in_stack_ffffffffffffec68);
  DataStream::~DataStream((DataStream *)in_stack_ffffffffffffec68);
  TestHeaderAndShortIDs::~TestHeaderAndShortIDs((TestHeaderAndShortIDs *)in_stack_ffffffffffffec68);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec68);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffeca8,
               (const_string *)in_stack_ffffffffffffeca0,
               CONCAT44(in_stack_ffffffffffffec9c,in_stack_ffffffffffffec98),
               (const_string *)in_stack_ffffffffffffec90);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_ffffffffffffec70,(char (*) [1])in_stack_ffffffffffffec68);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_ffffffffffffec78,
               (pointer)in_stack_ffffffffffffec70,(unsigned_long)in_stack_ffffffffffffec68);
    CTxMemPool::get(in_stack_ffffffffffffecb0,(uint256 *)in_stack_ffffffffffffeca8);
    local_1008._24_8_ =
         std::__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>::use_count
                   ((__shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> *)
                    in_stack_ffffffffffffec68);
    local_1008._0_8_ = (pointer)0x3;
    in_stack_ffffffffffffec78 = "SHARED_TX_OFFSET - 1";
    in_stack_ffffffffffffec70 = (PartiallyDownloadedBlock *)local_1008;
    in_stack_ffffffffffffec68 = "pool.get(txhash).use_count()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,long,long>
              (local_1008 + 0x30,local_1008 + 0x20,0xd6,1,2,local_1008 + 0x18);
    std::shared_ptr<const_CTransaction>::~shared_ptr
              ((shared_ptr<const_CTransaction> *)in_stack_ffffffffffffec68);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_ffffffffffffec68);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec68);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)in_stack_ffffffffffffec68);
  CBlock::~CBlock((CBlock *)in_stack_ffffffffffffec68);
  FastRandomContext::~FastRandomContext((FastRandomContext *)in_stack_ffffffffffffec68);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(NonCoinbasePreforwardRTTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    TestMemPoolEntryHelper entry;
    auto rand_ctx(FastRandomContext(uint256{42}));
    CBlock block(BuildBlockTestCase(rand_ctx));

    LOCK2(cs_main, pool.cs);
    pool.addUnchecked(entry.FromTx(block.vtx[2]));
    BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 0);

    uint256 txhash;

    // Test with pre-forwarding tx 1, but not coinbase
    {
        TestHeaderAndShortIDs shortIDs(block, rand_ctx);
        shortIDs.prefilledtxn.resize(1);
        shortIDs.prefilledtxn[0] = {1, block.vtx[1]};
        shortIDs.shorttxids.resize(2);
        shortIDs.shorttxids[0] = shortIDs.GetShortID(block.vtx[0]->GetWitnessHash());
        shortIDs.shorttxids[1] = shortIDs.GetShortID(block.vtx[2]->GetWitnessHash());

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(!partialBlock.IsTxAvailable(0));
        BOOST_CHECK( partialBlock.IsTxAvailable(1));
        BOOST_CHECK( partialBlock.IsTxAvailable(2));

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 1); // +1 because of partialBlock

        CBlock block2;
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            BOOST_CHECK(partialBlock.FillBlock(block2, {}) == READ_STATUS_INVALID); // No transactions
            partialBlock = tmp;
        }

        // Wrong transaction
        {
            PartiallyDownloadedBlock tmp = partialBlock;
            partialBlock.FillBlock(block2, {block.vtx[1]}); // Current implementation doesn't check txn here, but don't require that
            partialBlock = tmp;
        }
        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 2); // +2 because of partialBlock and block2
        bool mutated;
        BOOST_CHECK(block.hashMerkleRoot != BlockMerkleRoot(block2, &mutated));

        CBlock block3;
        PartiallyDownloadedBlock partialBlockCopy = partialBlock;
        BOOST_CHECK(partialBlock.FillBlock(block3, {block.vtx[0]}) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block3.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block3, &mutated).ToString());
        BOOST_CHECK(!mutated);

        BOOST_CHECK_EQUAL(pool.get(block.vtx[2]->GetHash()).use_count(), SHARED_TX_OFFSET + 3); // +2 because of partialBlock and block2 and block3

        txhash = block.vtx[2]->GetHash();
        block.vtx.clear();
        block2.vtx.clear();
        block3.vtx.clear();
        BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET + 1 - 1); // + 1 because of partialBlock; -1 because of block.
    }
    BOOST_CHECK_EQUAL(pool.get(txhash).use_count(), SHARED_TX_OFFSET - 1); // -1 because of block
}